

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t merge_block(archive_read *a,ssize_t block_size,uint8_t **p)

{
  undefined8 uVar1;
  wchar_t wVar2;
  void *pvVar3;
  size_t local_58;
  uint8_t *puStack_48;
  wchar_t ret;
  uint8_t *lp;
  ssize_t partial_offset;
  ssize_t cur_block_size;
  rar5 *rar;
  uint8_t **p_local;
  ssize_t block_size_local;
  archive_read *a_local;
  
  rar = (rar5 *)p;
  p_local = (uint8_t **)block_size;
  block_size_local = (ssize_t)a;
  cur_block_size = (ssize_t)get_context(a);
  lp = (uint8_t *)0x0;
  if (((rar5 *)cur_block_size)->merge_mode == L'\0') {
    *(byte *)&((rar5 *)cur_block_size)->cstate =
         *(byte *)&((rar5 *)cur_block_size)->cstate & 0xfb | 4;
    if ((((rar5 *)cur_block_size)->vol).push_buf != (uint8_t *)0x0) {
      free((((rar5 *)cur_block_size)->vol).push_buf);
    }
    pvVar3 = malloc((size_t)(p_local + 1));
    *(void **)(cur_block_size + 0x5320) = pvVar3;
    if (*(long *)(cur_block_size + 0x5320) == 0) {
      archive_set_error((archive *)block_size_local,0xc,
                        "Can\'t allocate memory for a merge block buffer.");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      memset((void *)(*(long *)(cur_block_size + 0x5320) + (long)p_local),0,8);
      do {
        do {
          if ((long)p_local - (long)lp < *(long *)(cur_block_size + 0x4ba8)) {
            local_58 = (long)p_local - (long)lp;
          }
          else {
            local_58 = *(size_t *)(cur_block_size + 0x4ba8);
          }
          partial_offset = local_58;
          if (local_58 == 0) {
            archive_set_error((archive *)block_size_local,0x54,
                              "Encountered block size == 0 during block merge");
            return L'\xffffffe2';
          }
          wVar2 = read_ahead((archive_read *)block_size_local,local_58,&stack0xffffffffffffffb8);
          if (wVar2 == L'\0') {
            return L'\x01';
          }
          if ((long)p_local < (long)(lp + partial_offset)) {
            archive_set_error((archive *)block_size_local,0x16,
                              "Consumed too much data when merging blocks.");
            return L'\xffffffe2';
          }
          memcpy(lp + *(long *)(cur_block_size + 0x5320),puStack_48,partial_offset);
          wVar2 = consume((archive_read *)block_size_local,partial_offset);
          if (wVar2 != L'\0') {
            return L'\x01';
          }
          lp = lp + partial_offset;
          *(long *)(cur_block_size + 0x4ba8) = *(long *)(cur_block_size + 0x4ba8) - partial_offset;
          if ((uint8_t **)lp == p_local) {
            uVar1 = *(undefined8 *)(cur_block_size + 0x5320);
            rar->header_initialized = (int)uVar1;
            rar->skipped_magic = (int)((ulong)uVar1 >> 0x20);
            return L'\0';
          }
        } while (*(long *)(cur_block_size + 0x4ba8) != 0);
        *(int *)(cur_block_size + 0xc) = *(int *)(cur_block_size + 0xc) + 1;
        a_local._4_4_ = advance_multivolume((archive_read *)block_size_local);
        *(int *)(cur_block_size + 0xc) = *(int *)(cur_block_size + 0xc) + -1;
      } while (a_local._4_4_ == L'\0');
    }
  }
  else {
    archive_set_error((archive *)block_size_local,0x16,"Recursive merge is not allowed");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int merge_block(struct archive_read* a, ssize_t block_size,
    const uint8_t** p)
{
	struct rar5* rar = get_context(a);
	ssize_t cur_block_size, partial_offset = 0;
	const uint8_t* lp;
	int ret;

	if(rar->merge_mode) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Recursive merge is not allowed");

		return ARCHIVE_FATAL;
	}

	/* Set a flag that we're in the switching mode. */
	rar->cstate.switch_multivolume = 1;

	/* Reallocate the memory which will hold the whole block. */
	if(rar->vol.push_buf)
		free((void*) rar->vol.push_buf);

	/* Increasing the allocation block by 8 is due to bit reading functions,
	 * which are using additional 2 or 4 bytes. Allocating the block size
	 * by exact value would make bit reader perform reads from invalid
	 * memory block when reading the last byte from the buffer. */
	rar->vol.push_buf = malloc(block_size + 8);
	if(!rar->vol.push_buf) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a merge block buffer.");
		return ARCHIVE_FATAL;
	}

	/* Valgrind complains if the extension block for bit reader is not
	 * initialized, so initialize it. */
	memset(&rar->vol.push_buf[block_size], 0, 8);

	/* A single block can span across multiple multivolume archive files,
	 * so we use a loop here. This loop will consume enough multivolume
	 * archive files until the whole block is read. */

	while(1) {
		/* Get the size of current block chunk in this multivolume
		 * archive file and read it. */
		cur_block_size = rar5_min(rar->file.bytes_remaining,
		    block_size - partial_offset);

		if(cur_block_size == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered block size == 0 during block merge");
			return ARCHIVE_FATAL;
		}

		if(!read_ahead(a, cur_block_size, &lp))
			return ARCHIVE_EOF;

		/* Sanity check; there should never be a situation where this
		 * function reads more data than the block's size. */
		if(partial_offset + cur_block_size > block_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_PROGRAMMER,
			    "Consumed too much data when merging blocks.");
			return ARCHIVE_FATAL;
		}

		/* Merge previous block chunk with current block chunk,
		 * or create first block chunk if this is our first
		 * iteration. */
		memcpy(&rar->vol.push_buf[partial_offset], lp, cur_block_size);

		/* Advance the stream read pointer by this block chunk size. */
		if(ARCHIVE_OK != consume(a, cur_block_size))
			return ARCHIVE_EOF;

		/* Update the pointers. `partial_offset` contains information
		 * about the sum of merged block chunks. */
		partial_offset += cur_block_size;
		rar->file.bytes_remaining -= cur_block_size;

		/* If `partial_offset` is the same as `block_size`, this means
		 * we've merged all block chunks and we have a valid full
		 * block. */
		if(partial_offset == block_size) {
			break;
		}

		/* If we don't have any bytes to read, this means we should
		 * switch to another multivolume archive file. */
		if(rar->file.bytes_remaining == 0) {
			rar->merge_mode++;
			ret = advance_multivolume(a);
			rar->merge_mode--;
			if(ret != ARCHIVE_OK) {
				return ret;
			}
		}
	}

	*p = rar->vol.push_buf;

	/* If we're here, we can resume unpacking by processing the block
	 * pointed to by the `*p` memory pointer. */

	return ARCHIVE_OK;
}